

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O2

int sshproxy_askappend(LogPolicy *lp,Filename *filename,_func_void_void_ptr_int *callback,void *ctx)

{
  int iVar1;
  char *pcVar2;
  
  if (lp[-0x411].vt != (LogPolicyVtable *)0x0) {
    iVar1 = (**(code **)((lp[-0x411].vt)->eventlog + 8))();
    return iVar1;
  }
  pcVar2 = filename_to_str(filename);
  pcVar2 = dupprintf("Log file \"%s\" already exists; logging cancelled",pcVar2);
  sshproxy_eventlog(lp,pcVar2);
  safefree(pcVar2);
  return 0;
}

Assistant:

static int sshproxy_askappend(LogPolicy *lp, Filename *filename,
                              void (*callback)(void *ctx, int result),
                              void *ctx)
{
    SshProxy *sp = container_of(lp, SshProxy, logpolicy);

    /*
     * If we have access to the outer LogPolicy, pass on this request
     * to the end user.
     */
    if (sp->clientlp)
        return lp_askappend(sp->clientlp, filename, callback, ctx);

    /*
     * Otherwise, fall back to the safe noninteractive assumption.
     */
    char *msg = dupprintf("Log file \"%s\" already exists; logging cancelled",
                          filename_to_str(filename));
    sshproxy_eventlog(lp, msg);
    sfree(msg);
    return 0;
}